

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseMumpsCoverage::FindMumpsFile(cmParseMumpsCoverage *this,string *routine,string *filepath)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_a0 [3];
  _Base_ptr local_88;
  undefined1 local_80 [8];
  string routine2;
  int k;
  char *tryname [4];
  _Self local_30;
  iterator i;
  string *filepath_local;
  string *routine_local;
  cmParseMumpsCoverage *this_local;
  
  i._M_node = (_Base_ptr)filepath;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->RoutineToDirectory,routine);
  tryname[3] = (char *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::end(&this->RoutineToDirectory);
  bVar1 = std::operator!=(&local_30,(_Self *)(tryname + 3));
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_30);
    std::__cxx11::string::operator=((string *)i._M_node,(string *)&ppVar2->second);
    this_local._7_1_ = 1;
  }
  else {
    tryname[0] = "GTM";
    tryname[1] = "ONT";
    tryname[2] = (char *)0x0;
    routine2.field_2._12_4_ = 0;
    while (tryname[(long)(int)routine2.field_2._12_4_ + -1] != (char *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     routine,tryname[(long)(int)routine2.field_2._12_4_ + -1]);
      local_88 = (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this->RoutineToDirectory,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_80);
      local_30._M_node = local_88;
      local_a0[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->RoutineToDirectory);
      bVar1 = std::operator!=(&local_30,local_a0);
      if (bVar1) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_30);
        std::__cxx11::string::operator=((string *)i._M_node,(string *)&ppVar2->second);
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_80);
      if (bVar1) goto LAB_005897d9;
      routine2.field_2._12_4_ = routine2.field_2._12_4_ + 1;
    }
    this_local._7_1_ = 0;
  }
LAB_005897d9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmParseMumpsCoverage::FindMumpsFile(std::string const& routine,
                                         std::string& filepath)
{
  std::map<std::string, std::string>::iterator i =
    this->RoutineToDirectory.find(routine);
  if (i != this->RoutineToDirectory.end()) {
    filepath = i->second;
    return true;
  }
  // try some alternate names
  const char* tryname[] = { "GUX", "GTM", "ONT", CM_NULLPTR };
  for (int k = 0; tryname[k] != CM_NULLPTR; k++) {
    std::string routine2 = routine + tryname[k];
    i = this->RoutineToDirectory.find(routine2);
    if (i != this->RoutineToDirectory.end()) {
      filepath = i->second;
      return true;
    }
  }
  return false;
}